

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraCore.c
# Opt level: O3

void Fra_FraigVerifyCounterEx(Fra_Man_t *p,Vec_Int_t *vCex)

{
  undefined1 *puVar1;
  byte *pbVar2;
  void *pvVar3;
  long *plVar4;
  Fra_Cla_t *pFVar5;
  Aig_Man_t *pAVar6;
  long lVar7;
  Vec_Ptr_t *pVVar8;
  uint uVar9;
  long lVar10;
  long *plVar11;
  
  pAVar6 = p->pManAig;
  if (pAVar6->nObjs[2] != vCex->nSize) {
    __assert_fail("Aig_ManCiNum(p->pManAig) == Vec_IntSize(vCex)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraCore.c"
                  ,0xbe,"void Fra_FraigVerifyCounterEx(Fra_Man_t *, Vec_Int_t *)");
  }
  lVar7 = (long)pAVar6->vObjs->nSize;
  if (0 < lVar7) {
    lVar10 = 0;
    do {
      pvVar3 = pAVar6->vObjs->pArray[lVar10];
      if ((pvVar3 != (void *)0x0) && ((*(byte *)((long)pvVar3 + 0x18) & 0x20) != 0)) {
        __assert_fail("!pObj->fMarkB",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraCore.c"
                      ,0xc1,"void Fra_FraigVerifyCounterEx(Fra_Man_t *, Vec_Int_t *)");
      }
      lVar10 = lVar10 + 1;
    } while (lVar7 != lVar10);
  }
  puVar1 = &pAVar6->pConst1->field_0x18;
  *(ulong *)puVar1 = *(ulong *)puVar1 | 0x20;
  pAVar6 = p->pManAig;
  pVVar8 = pAVar6->vCis;
  if (0 < pVVar8->nSize) {
    lVar7 = 0;
    do {
      if (vCex->nSize <= lVar7) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      *(ulong *)((long)pVVar8->pArray[lVar7] + 0x18) =
           *(ulong *)((long)pVVar8->pArray[lVar7] + 0x18) & 0xffffffffffffffdf |
           (ulong)((vCex->pArray[lVar7] & 1U) << 5);
      lVar7 = lVar7 + 1;
      pAVar6 = p->pManAig;
      pVVar8 = pAVar6->vCis;
    } while (lVar7 < pVVar8->nSize);
  }
  pVVar8 = pAVar6->vObjs;
  if (0 < pVVar8->nSize) {
    lVar7 = 0;
    do {
      pvVar3 = pVVar8->pArray[lVar7];
      if ((pvVar3 != (void *)0x0) && (0xfffffffd < ((uint)*(ulong *)((long)pvVar3 + 0x18) & 7) - 7))
      {
        *(ulong *)((long)pvVar3 + 0x18) =
             *(ulong *)((long)pvVar3 + 0x18) & 0xffffffffffffffdf |
             (ulong)((((uint)*(ulong *)((long)pvVar3 + 0x10) ^
                      *(uint *)((*(ulong *)((long)pvVar3 + 0x10) & 0xfffffffffffffffe) + 0x18) >> 5)
                      & ((uint)*(ulong *)((long)pvVar3 + 8) ^
                        *(uint *)((*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe) + 0x18) >> 5)
                     & 1) << 5);
        pAVar6 = p->pManAig;
      }
      lVar7 = lVar7 + 1;
      pVVar8 = pAVar6->vObjs;
    } while (lVar7 < pVVar8->nSize);
  }
  pVVar8 = pAVar6->vCos;
  if (0 < pVVar8->nSize) {
    lVar7 = 0;
    do {
      pvVar3 = pVVar8->pArray[lVar7];
      *(ulong *)((long)pvVar3 + 0x18) =
           *(ulong *)((long)pvVar3 + 0x18) & 0xffffffffffffffdf |
           (ulong)(((int)*(ulong *)((long)pvVar3 + 8) << 5 ^
                   *(uint *)((*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe) + 0x18)) & 0x20);
      lVar7 = lVar7 + 1;
      pVVar8 = p->pManAig->vCos;
    } while (lVar7 < pVVar8->nSize);
  }
  pFVar5 = p->pCla;
  pVVar8 = pFVar5->vClasses1;
  if (0 < pVVar8->nSize) {
    lVar7 = 0;
    do {
      uVar9 = *(uint *)((long)pVVar8->pArray[lVar7] + 0x18);
      if (((uVar9 >> 5 ^ uVar9 >> 3) & 1) != 0) {
        printf("The node %d is not constant under cex!\n",
               (ulong)*(uint *)((long)pVVar8->pArray[lVar7] + 0x24));
        pFVar5 = p->pCla;
      }
      lVar7 = lVar7 + 1;
      pVVar8 = pFVar5->vClasses1;
    } while (lVar7 < pVVar8->nSize);
  }
  pVVar8 = pFVar5->vClasses;
  if (0 < pVVar8->nSize) {
    lVar7 = 0;
    do {
      plVar4 = (long *)pVVar8->pArray[lVar7];
      lVar10 = plVar4[1];
      if (lVar10 != 0) {
        plVar11 = plVar4 + 2;
        do {
          uVar9 = *(uint *)(lVar10 + 0x18) ^ *(uint *)(*plVar4 + 0x18);
          if (((uVar9 >> 5 ^ uVar9 >> 3) & 1) != 0) {
            printf("The nodes %d and %d are not equal under cex!\n",(ulong)*(uint *)(*plVar4 + 0x24)
                   ,(ulong)*(uint *)(lVar10 + 0x24));
          }
          lVar10 = *plVar11;
          plVar11 = plVar11 + 1;
        } while (lVar10 != 0);
        pFVar5 = p->pCla;
      }
      lVar7 = lVar7 + 1;
      pVVar8 = pFVar5->vClasses;
    } while (lVar7 < pVVar8->nSize);
  }
  pAVar6 = p->pManAig;
  pVVar8 = pAVar6->vObjs;
  if (0 < pVVar8->nSize) {
    lVar7 = 0;
    do {
      if (pVVar8->pArray[lVar7] != (void *)0x0) {
        pbVar2 = (byte *)((long)pVVar8->pArray[lVar7] + 0x18);
        *pbVar2 = *pbVar2 & 0xdf;
        pAVar6 = p->pManAig;
      }
      lVar7 = lVar7 + 1;
      pVVar8 = pAVar6->vObjs;
    } while (lVar7 < pVVar8->nSize);
  }
  return;
}

Assistant:

void Fra_FraigVerifyCounterEx( Fra_Man_t * p, Vec_Int_t * vCex )
{
    Aig_Obj_t * pObj, ** ppClass;
    int i, c;
    assert( Aig_ManCiNum(p->pManAig) == Vec_IntSize(vCex) );
    // make sure the input pattern is not used
    Aig_ManForEachObj( p->pManAig, pObj, i )
        assert( !pObj->fMarkB );
    // simulate the cex through the AIG
    Aig_ManConst1(p->pManAig)->fMarkB = 1;
    Aig_ManForEachCi( p->pManAig, pObj, i )
        pObj->fMarkB = Vec_IntEntry(vCex, i);
    Aig_ManForEachNode( p->pManAig, pObj, i )
        pObj->fMarkB = (Aig_ObjFanin0(pObj)->fMarkB ^ Aig_ObjFaninC0(pObj)) & 
                       (Aig_ObjFanin1(pObj)->fMarkB ^ Aig_ObjFaninC1(pObj));
    Aig_ManForEachCo( p->pManAig, pObj, i )
        pObj->fMarkB = Aig_ObjFanin0(pObj)->fMarkB ^ Aig_ObjFaninC0(pObj);
    // check if the classes hold
    Vec_PtrForEachEntry( Aig_Obj_t *, p->pCla->vClasses1, pObj, i )
    {
        if ( pObj->fPhase != pObj->fMarkB )
            printf( "The node %d is not constant under cex!\n", pObj->Id );
    }
    Vec_PtrForEachEntry( Aig_Obj_t **, p->pCla->vClasses, ppClass, i )
    {
        for ( c = 1; ppClass[c]; c++ )
            if ( (ppClass[0]->fPhase ^ ppClass[c]->fPhase) != (ppClass[0]->fMarkB ^ ppClass[c]->fMarkB) )
                printf( "The nodes %d and %d are not equal under cex!\n", ppClass[0]->Id, ppClass[c]->Id );
//        for ( c = 0; ppClass[c]; c++ )
//            if ( Fra_ObjFraig(ppClass[c],p->pPars->nFramesK) == Aig_ManConst1(p->pManFraig) )
//                printf( "A member of non-constant class has a constant repr!\n" );
    }
    // clean the simulation pattern
    Aig_ManForEachObj( p->pManAig, pObj, i )
        pObj->fMarkB = 0;
}